

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.cpp
# Opt level: O2

void __thiscall pbrt::MLTSampler::EnsureReady(MLTSampler *this,int index)

{
  PrimarySample *pPVar1;
  PrimarySample *pPVar2;
  long lVar3;
  ulong uVar4;
  Float FVar5;
  float fVar6;
  float fVar7;
  float u;
  undefined1 auVar8 [16];
  undefined1 in_register_000012c4 [12];
  
  uVar4 = (ulong)index;
  if ((this->X).nStored <= uVar4) {
    pstd::
    vector<pbrt::MLTSampler::PrimarySample,_pstd::pmr::polymorphic_allocator<pbrt::MLTSampler::PrimarySample>_>
    ::resize(&this->X,(long)(index + 1));
  }
  pPVar2 = (this->X).ptr;
  pPVar1 = pPVar2 + uVar4;
  lVar3 = pPVar2[uVar4].lastModificationIteration;
  if (lVar3 < this->lastLargeStepIteration) {
    FVar5 = RNG::Uniform<float>(&this->rng);
    pPVar1->value = FVar5;
    lVar3 = this->lastLargeStepIteration;
    pPVar1->lastModificationIteration = lVar3;
  }
  else {
    FVar5 = pPVar1->value;
  }
  pPVar1->valueBackup = FVar5;
  pPVar1->modifyBackup = lVar3;
  if (this->largeStep == true) {
    fVar6 = RNG::Uniform<float>(&this->rng);
  }
  else {
    fVar6 = this->sigma;
    auVar8._0_4_ = (float)(this->currentIteration - lVar3);
    auVar8._4_12_ = in_register_000012c4;
    if (auVar8._0_4_ < 0.0) {
      fVar7 = sqrtf(auVar8._0_4_);
    }
    else {
      auVar8 = vsqrtss_avx(auVar8,auVar8);
      fVar7 = auVar8._0_4_;
    }
    u = RNG::Uniform<float>(&this->rng);
    FVar5 = SampleNormal(u,0.0,fVar6 * fVar7);
    fVar6 = FVar5 + pPVar1->value;
    auVar8 = vroundss_avx(ZEXT416((uint)fVar6),ZEXT416((uint)fVar6),9);
    fVar6 = fVar6 - auVar8._0_4_;
  }
  pPVar1->value = fVar6;
  pPVar1->lastModificationIteration = this->currentIteration;
  return;
}

Assistant:

void MLTSampler::EnsureReady(int index) {
#ifdef PBRT_IS_GPU_CODE
    LOG_FATAL("MLTSampler not supported on GPU--needs vector resize...");
    return;
#else
    // Enlarge _MLTSampler::X_ if necessary and get current $\VEC{X}_i$
    if (index >= X.size())
        X.resize(index + 1);
    PrimarySample &Xi = X[index];

    // Reset $\VEC{X}_i$ if a large step took place in the meantime
    if (Xi.lastModificationIteration < lastLargeStepIteration) {
        Xi.value = rng.Uniform<Float>();
        Xi.lastModificationIteration = lastLargeStepIteration;
    }

    // Apply remaining sequence of mutations to _sample_
    Xi.Backup();
    if (largeStep) {
        Xi.value = rng.Uniform<Float>();
    } else {
        int64_t nSmall = currentIteration - Xi.lastModificationIteration;
        // Apply _nSmall_ small step mutations to $\VEC{X}_i$
        Float effSigma = sigma * std::sqrt((Float)nSmall);
        Float delta = SampleNormal(rng.Uniform<Float>(), 0, effSigma);
        Xi.value += delta;
        Xi.value -= std::floor(Xi.value);
    }
    Xi.lastModificationIteration = currentIteration;

#endif
}